

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v9::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  fp x;
  appender out;
  result rVar1;
  int iVar2;
  decimal_fp<float> dVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  buffer<char> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  int in_EDI;
  bool bVar7;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  decimal_fp<double> dVar8;
  fp fVar9;
  basic_fp<unsigned_long_long> value_00;
  size_t num_digits;
  int max_double_digits;
  bool is_predecessor_closer;
  basic_fp<unsigned___int128> f;
  gen_digits_handler handler;
  fp cached_pow;
  fp normalized;
  int cached_exp10;
  int min_exp;
  decimal_fp<double> dec;
  int in_stack_00000190;
  uint in_stack_00000194;
  decimal_fp<float> dec_1;
  uint dragon_flags;
  bool use_dragon;
  int exp;
  bool fixed;
  convert_float_result<double> converted_value;
  result result_1;
  char digit_1;
  result result;
  uint64_t remainder;
  anon_class_16_2_fdf32556 divmod_integral;
  uint32_t digit;
  round_direction dir;
  uint64_t divisor;
  uint64_t fractional;
  uint32_t integral;
  fp one;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  buffer<char> *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  undefined4 in_stack_fffffffffffffdb8;
  undefined2 in_stack_fffffffffffffdbc;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  basic_fp<unsigned___int128> *in_stack_fffffffffffffdc0;
  char in_stack_fffffffffffffdd7;
  char cVar10;
  gen_digits_handler *in_stack_fffffffffffffdd8;
  basic_fp<unsigned___int128> *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffe00;
  uint value_01;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  float in_stack_fffffffffffffe1c;
  undefined8 local_1d8;
  undefined8 local_1d0;
  char *local_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  byte local_19c;
  unsigned_long_long local_198;
  int local_190;
  unsigned_long_long local_188;
  double in_stack_fffffffffffffe80;
  detail *local_120;
  uint local_118;
  int iStack_c4;
  int local_b8;
  undefined1 local_b2;
  byte local_b1;
  convert_float_result<double> local_b0;
  buffer<char> *local_a8;
  int local_9c;
  double local_98;
  undefined8 local_90;
  result local_84;
  char local_7d;
  result local_7c;
  long local_78;
  anon_class_16_2_fdf32556 local_70;
  uint32_t local_60;
  round_direction local_5c;
  long local_58;
  ulong local_50;
  uint32_t local_44;
  basic_fp<unsigned_long_long> local_40;
  char **local_30;
  int *local_28;
  long local_20;
  ulong local_18;
  int local_10;
  result local_4;
  
  value_01 = (uint)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  local_98 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if (local_98 < 0.0) {
    assert_fail((char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,(char *)0x1d97e3);
  }
  local_a8 = in_RDX;
  local_9c = in_EDI;
  local_90 = in_RSI;
  local_b0 = convert_float<double>(local_98);
  local_b1 = (char)((ulong)local_90 >> 0x20) == '\x02';
  if (local_98 <= 0.0) {
    if ((0 < local_9c) && ((bool)local_b1)) {
      to_unsigned<int>(0);
      cVar10 = (char)((uint)in_stack_fffffffffffffd98 >> 0x18);
      buffer<char>::try_resize
                ((buffer<char> *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      buffer<char>::data(local_a8);
      fill_n<char,int>((char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,cVar10);
      return -local_9c;
    }
    local_b2 = 0x30;
    buffer<char>::push_back
              (in_stack_fffffffffffffda0,
               (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    return 0;
  }
  local_b8 = 0;
  if (local_9c < 0) {
    if ((local_90._4_4_ >> 0x12 & 1) != 0) {
      dVar3 = dragonbox::to_decimal<float>(in_stack_fffffffffffffe1c);
      appender::back_insert_iterator
                ((appender *)in_stack_fffffffffffffda0,
                 (buffer<char> *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      write<char,_fmt::v9::appender,_unsigned_int,_0>
                ((appender)in_stack_fffffffffffffe08.container,value_01);
      iStack_c4 = dVar3.exponent;
      return iStack_c4;
    }
    dVar8 = dragonbox::to_decimal<double>(in_stack_fffffffffffffe80);
    appender::back_insert_iterator
              ((appender *)in_stack_fffffffffffffda0,
               (buffer<char> *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container._4_4_ =
         in_stack_fffffffffffffe1c;
    out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container._0_4_ =
         in_stack_fffffffffffffe18;
    write<char,_fmt::v9::appender,_unsigned_long,_0>
              (out,CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    return dVar8.exponent;
  }
  basic_fp<unsigned_long_long>::basic_fp<double>
            ((basic_fp<unsigned_long_long> *)in_stack_fffffffffffffda0,
             (double)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  value_00.f = (ulong)local_118;
  value_00._8_8_ = extraout_RDX;
  normalize<0,unsigned_long_long>(local_120,value_00);
  fVar9 = get_cached_power((int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                           (int *)CONCAT17(in_stack_fffffffffffffdbf,
                                           CONCAT16(in_stack_fffffffffffffdbe,
                                                    CONCAT24(in_stack_fffffffffffffdbc,
                                                             in_stack_fffffffffffffdb8))));
  local_188 = fVar9.f;
  x.f._4_4_ = in_stack_fffffffffffffdac;
  x.f._0_4_ = in_stack_fffffffffffffda8;
  x._8_7_ = in_stack_fffffffffffffdb0;
  x._15_1_ = in_stack_fffffffffffffdb7;
  fVar9.f._4_4_ = in_stack_fffffffffffffd9c;
  fVar9.f._0_4_ = in_stack_fffffffffffffd98;
  fVar9._8_8_ = in_stack_fffffffffffffda0;
  fVar9 = operator*(x,fVar9);
  iVar2 = fVar9.e;
  local_198 = fVar9.f;
  local_190 = iVar2;
  local_1b0 = buffer<char>::data(local_a8);
  local_1a8 = 0;
  local_1a4 = local_9c;
  local_1a0 = 0;
  local_19c = local_b1 & 1;
  local_20 = 1;
  local_28 = &local_b8;
  local_30 = &local_1b0;
  local_18 = fVar9.f;
  local_10 = iVar2;
  basic_fp<unsigned_long_long>::basic_fp(&local_40,1L << (-(char)fVar9.e & 0x3fU),iVar2);
  uVar4 = local_18 >> (-(char)local_40.e & 0x3fU);
  local_44 = (uint32_t)uVar4;
  if (local_44 == 0) {
    assert_fail((char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,(char *)0x1d9c4e);
  }
  if ((uVar4 & 0xffffffff) != local_18 >> (-(char)local_40.e & 0x3fU)) {
    assert_fail((char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,(char *)0x1d9cb0);
  }
  local_50 = local_18 & local_40.f - 1;
  iVar2 = count_digits(local_44);
  *local_28 = iVar2;
  rVar1 = local_7c;
  if ((*(byte *)((long)local_30 + 0x14) & 1) != 0) {
    adjust_precision((int *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                     in_stack_fffffffffffffdac);
    rVar1 = local_7c;
    if (*(int *)((long)local_30 + 0xc) < 1) {
      if (*(int *)((long)local_30 + 0xc) < 0) {
        local_4 = done;
      }
      else {
        local_58 = basic_data<void>::power_of_10_64[*local_28 + -1] << (-(char)local_40.e & 0x3fU);
        local_5c = get_round_direction(CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
                                       ,(uint64_t)in_stack_fffffffffffffda0,
                                       CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                                      );
        if (local_5c == unknown) {
          local_4 = error;
        }
        else {
          cVar10 = '1';
          if (local_5c != up) {
            cVar10 = '0';
          }
          pcVar6 = *local_30;
          iVar2 = *(int *)(local_30 + 1);
          *(int *)(local_30 + 1) = iVar2 + 1;
          pcVar6[iVar2] = cVar10;
          local_4 = done;
        }
      }
      goto LAB_001da0b6;
    }
  }
  do {
    local_7c = rVar1;
    local_60 = 0;
    local_70.digit = &local_60;
    local_70.integral = &local_44;
    uVar4 = (ulong)(*local_28 - 1);
    switch(uVar4) {
    case 0:
      local_60 = local_44;
      local_44 = 0;
      break;
    case 1:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_70,10);
      break;
    case 2:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_70,100);
      break;
    case 3:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_70,1000);
      break;
    case 4:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_70,10000);
      break;
    case 5:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_70,100000);
      break;
    case 6:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_70,1000000);
      break;
    case 7:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_70,10000000);
      break;
    case 8:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_70,100000000);
      break;
    case 9:
      grisu_gen_digits::anon_class_16_2_fdf32556::operator()(&local_70,1000000000);
      break;
    default:
      assert_fail((char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,(char *)0x1d9f31);
    }
    *local_28 = *local_28 + -1;
    local_78 = ((ulong)local_44 << (-(char)local_40.e & 0x3fU)) + local_50;
    local_7c = gen_digits_handler::on_digit
                         (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd7,uVar4,
                          (uint64_t)in_stack_fffffffffffffdc0,
                          CONCAT17(in_stack_fffffffffffffdbf,
                                   CONCAT16(in_stack_fffffffffffffdbe,
                                            CONCAT24(in_stack_fffffffffffffdbc,
                                                     in_stack_fffffffffffffdb8))),
                          (bool)in_stack_fffffffffffffdb7);
    local_4 = local_7c;
    if (local_7c != more) goto LAB_001da0b6;
    rVar1 = more;
  } while (0 < *local_28);
  while( true ) {
    local_20 = local_20 * 10;
    local_7d = (char)(local_50 * 10 >> (-(char)local_40.e & 0x3fU)) + '0';
    local_50 = local_40.f - 1 & local_50 * 10;
    *local_28 = *local_28 + -1;
    local_84 = gen_digits_handler::on_digit
                         (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd7,uVar4,
                          (uint64_t)in_stack_fffffffffffffdc0,
                          CONCAT17(in_stack_fffffffffffffdbf,
                                   CONCAT16(in_stack_fffffffffffffdbe,
                                            CONCAT24(in_stack_fffffffffffffdbc,
                                                     in_stack_fffffffffffffdb8))),
                          (bool)in_stack_fffffffffffffdb7);
    local_4 = local_84;
    if (local_84 != more) break;
    local_84 = more;
  }
LAB_001da0b6:
  if (local_4 == error) {
    local_b8 = local_1a8 + -1 + local_b8;
    local_9c = local_1a4;
    basic_fp<unsigned___int128>::basic_fp((basic_fp<unsigned___int128> *)&stack0xfffffffffffffe18);
    if ((local_90._4_4_ >> 0x12 & 1) == 0) {
      basic_fp<unsigned___int128>::assign<double,_0>
                (in_stack_fffffffffffffde0,(double)in_stack_fffffffffffffdd8);
    }
    else {
      basic_fp<unsigned___int128>::assign<float,_0>
                (in_stack_fffffffffffffdc0,
                 (float)CONCAT13(in_stack_fffffffffffffdbf,
                                 CONCAT12(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdbc)));
    }
    if (0x2ff < local_9c) {
      local_9c = 0x2ff;
    }
    in_stack_fffffffffffffda8 = (int)local_1d8;
    in_stack_fffffffffffffdac = SUB84(local_1d8,4);
    in_stack_fffffffffffffdb0 = (undefined7)local_1d0;
    in_stack_fffffffffffffdb7 = SUB81(local_1d0,7);
    format_dragon(_dec_1,in_stack_00000194,in_stack_00000190,(buffer<char> *)dec._8_8_,
                  (int *)dec.significand);
  }
  else {
    local_b8 = local_1a0 + local_b8;
    to_unsigned<int>(0);
    buffer<char>::try_resize
              ((buffer<char> *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  }
  if (((local_b1 & 1) == 0) && ((local_90._4_4_ >> 0x13 & 1) == 0)) {
    sVar5 = buffer<char>::size(local_a8);
    while( true ) {
      bVar7 = false;
      if (sVar5 != 0) {
        pcVar6 = buffer<char>::operator[]<unsigned_long>(local_a8,sVar5 - 1);
        bVar7 = *pcVar6 == '0';
      }
      if (!bVar7) break;
      sVar5 = sVar5 - 1;
      local_b8 = local_b8 + 1;
    }
    buffer<char>::try_resize
              ((buffer<char> *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  }
  return local_b8;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    exp = static_cast<int>(
        std::ceil((f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10));
    dragon_flags = dragon::fixup;
  } else if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(converted_value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}